

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O2

FloatBilerpTexture *
pbrt::FloatBilerpTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  allocator<char> local_b4;
  allocator<char> local_b3;
  allocator<char> local_b2;
  allocator<char> local_b1;
  Float local_b0;
  Float local_ac;
  Float local_a8;
  Float local_a4;
  TextureMapping2DHandle map;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  FloatBilerpTexture *pFVar2;
  
  TextureMapping2DHandle::Create(&map,parameters->dict,renderFromTexture,loc,alloc);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"v00",&local_b1);
  local_a4 = TextureParameterDictionary::GetOneFloat(parameters,&local_38,0.0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"v01",&local_b2);
  local_a8 = TextureParameterDictionary::GetOneFloat(parameters,&local_58,1.0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"v10",&local_b3);
  local_ac = TextureParameterDictionary::GetOneFloat(parameters,&local_78,0.0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"v11",&local_b4);
  local_b0 = TextureParameterDictionary::GetOneFloat(parameters,&local_98,1.0);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x18,8);
  pFVar2 = (FloatBilerpTexture *)CONCAT44(extraout_var,iVar1);
  (pFVar2->mapping).
  super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  .bits = (uintptr_t)
          map.
          super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
          .bits;
  pFVar2->v00 = local_a4;
  pFVar2->v01 = local_a8;
  pFVar2->v10 = local_ac;
  pFVar2->v11 = local_b0;
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pFVar2;
}

Assistant:

FloatBilerpTexture *FloatBilerpTexture::Create(
    const Transform &renderFromTexture, const TextureParameterDictionary &parameters,
    const FileLoc *loc, Allocator alloc) {
    // Initialize 2D texture mapping _map_ from _tp_
    TextureMapping2DHandle map =
        TextureMapping2DHandle::Create(parameters, renderFromTexture, loc, alloc);

    return alloc.new_object<FloatBilerpTexture>(
        map, parameters.GetOneFloat("v00", 0.f), parameters.GetOneFloat("v01", 1.f),
        parameters.GetOneFloat("v10", 0.f), parameters.GetOneFloat("v11", 1.f));
}